

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O2

void __thiscall
f8n::runtime::MessageQueue::Debounce(MessageQueue *this,IMessagePtr *message,int64_t delayMs)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  __shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  iVar1 = (*((message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_IMessage[2])();
  uVar2 = (*((message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_IMessage[3])();
  (*(this->super_IMessageQueue)._vptr_IMessageQueue[3])
            (this,CONCAT44(extraout_var,iVar1),(ulong)uVar2);
  std::__shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             &message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>);
  (*(this->super_IMessageQueue)._vptr_IMessageQueue[2])(this,&local_30,delayMs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

void MessageQueue::Debounce(IMessagePtr message, int64_t delayMs) {
    Remove(message->Target(), message->Type());
    Post(message, delayMs);
}